

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  int iVar1;
  int iVar2;
  secp256k1_modinv64_modinfo *psVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  secp256k1_modinv64_modinfo *modinfo;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  long *extraout_RDX_02;
  long lVar12;
  long lVar13;
  long lVar14;
  secp256k1_fe *psVar15;
  secp256k1_modinv64_modinfo *unaff_RBP;
  int alen;
  ulong uVar16;
  secp256k1_fe *psVar17;
  secp256k1_fe *psVar18;
  secp256k1_fe *a;
  secp256k1_fe *psVar19;
  secp256k1_sha256 *psVar20;
  secp256k1_modinv64_modinfo *psVar21;
  long lVar22;
  long lVar23;
  secp256k1_fe *psVar24;
  uint64_t *puVar25;
  uint64_t uVar26;
  secp256k1_fe *psVar27;
  uint64_t *puVar28;
  long lVar29;
  secp256k1_fe *a_00;
  secp256k1_fe *psVar30;
  secp256k1_modinv64_modinfo *psVar31;
  secp256k1_modinv64_modinfo *psVar32;
  secp256k1_modinv64_modinfo *psVar33;
  byte bVar34;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_fe tmp;
  secp256k1_fe sStack_2e8;
  secp256k1_fe *psStack_2b8;
  secp256k1_sha256 *psStack_2b0;
  uchar auStack_2a4 [4];
  secp256k1_sha256 sStack_2a0;
  secp256k1_fe *psStack_238;
  secp256k1_fe *psStack_230;
  secp256k1_modinv64_modinfo *psStack_228;
  int iStack_21c;
  secp256k1_fe *psStack_218;
  secp256k1_fe *psStack_210;
  long lStack_208;
  long lStack_200;
  long lStack_1f8;
  long lStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_fe *psStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_modinv64_modinfo *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  uint local_1ac;
  secp256k1_fe *local_1a8;
  long local_1a0;
  ulong local_198;
  ulong local_190;
  secp256k1_fe *local_188;
  secp256k1_modinv64_modinfo *local_180;
  secp256k1_fe local_178;
  secp256k1_fe local_148;
  secp256k1_fe local_118;
  secp256k1_modinv64_trans2x2 local_e8;
  secp256k1_fe local_c8;
  secp256k1_modinv64_signed62 local_98;
  secp256k1_fe local_68;
  
  bVar34 = 0;
  psStack_1c0 = (secp256k1_fe *)0x11b180;
  local_188 = r;
  secp256k1_fe_verify(x);
  local_1a0 = 0x1000003d1;
  uVar7 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar16 = (uVar7 >> 0x34) + x->n[1];
  uVar9 = (uVar16 >> 0x34) + x->n[2];
  uVar10 = (uVar9 >> 0x34) + x->n[3];
  uVar11 = (uVar10 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_190 = (uVar16 | uVar7 | uVar9 | uVar10) & 0xfffffffffffff | uVar11;
  local_198 = (uVar7 ^ 0x1000003d0) & uVar16 & uVar9 & uVar10 & (uVar11 ^ 0xf000000000000);
  psStack_1c0 = (secp256k1_fe *)0x11b1fa;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psStack_1c0 = (secp256k1_fe *)0x11b229;
  local_1a8 = x;
  secp256k1_fe_normalize_var(&local_68);
  local_178.n[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_178.n[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_178.n[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_178.n[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_178.n[4] = local_68.n[4] >> 0x28;
  psVar31 = (secp256k1_modinv64_modinfo *)0x0;
  local_c8.n[4] = 0;
  local_c8.n[2] = 0;
  local_c8.n[3] = 0;
  local_c8.n[0] = 0;
  local_c8.n[1] = 0;
  local_98.v[1] = 0;
  local_98.v[4] = 0;
  local_98.v[2] = 0;
  local_98.v[3] = 0;
  local_98.v[0] = 1;
  local_148.n[2] = 0;
  local_148.n[3] = 0;
  local_148.n[0] = -0x1000003d1;
  local_148.n[1] = 0;
  local_148.n[4] = 0x100;
  psVar30 = (secp256k1_fe *)0xffffffffffffffff;
  psVar15 = (secp256k1_fe *)0x5;
  local_118.n[0] = local_178.n[0];
  local_118.n[1] = local_178.n[1];
  local_118.n[2] = local_178.n[2];
  local_118.n[3] = local_178.n[3];
  local_118.n[4] = local_178.n[4];
  do {
    psVar18 = (secp256k1_fe *)local_148.n[0];
    local_1ac = (uint)psVar15;
    psVar3 = (secp256k1_modinv64_modinfo *)0x0;
    psVar24 = (secp256k1_fe *)0x0;
    psVar21 = (secp256k1_modinv64_modinfo *)0x1;
    uVar8 = 0x3e;
    psVar17 = (secp256k1_fe *)0x1;
    uVar26 = local_118.n[0];
    a_00 = (secp256k1_fe *)local_148.n[0];
    psVar33 = psVar31;
    while( true ) {
      a = (secp256k1_fe *)(-1L << ((byte)uVar8 & 0x3f) | uVar26);
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      if (a != (secp256k1_fe *)0x0) {
        for (; ((ulong)a >> (long)modinfo & 1) == 0;
            modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1)) {
        }
      }
      bVar4 = (byte)modinfo;
      psVar27 = (secp256k1_fe *)(uVar26 >> (bVar4 & 0x3f));
      psVar17 = (secp256k1_fe *)((long)psVar17 << (bVar4 & 0x3f));
      psVar3 = (secp256k1_modinv64_modinfo *)((long)psVar3 << (bVar4 & 0x3f));
      psVar30 = (secp256k1_fe *)((long)psVar30 - (long)modinfo);
      uVar8 = uVar8 - (int)modinfo;
      local_180 = psVar31;
      if (uVar8 == 0) break;
      if (((ulong)a_00 & 1) == 0) {
        psStack_1c0 = (secp256k1_fe *)0x11b8a8;
        secp256k1_fe_inv_var_cold_8();
LAB_0011b8a8:
        psStack_1c0 = (secp256k1_fe *)0x11b8ad;
        secp256k1_fe_inv_var_cold_7();
LAB_0011b8ad:
        psStack_1c0 = (secp256k1_fe *)0x11b8b2;
        secp256k1_fe_inv_var_cold_1();
LAB_0011b8b2:
        psStack_1c0 = (secp256k1_fe *)0x11b8b7;
        secp256k1_fe_inv_var_cold_2();
LAB_0011b8b7:
        psStack_1c0 = (secp256k1_fe *)0x11b8bc;
        secp256k1_fe_inv_var_cold_6();
        psVar27 = a_00;
        goto LAB_0011b8bc;
      }
      if (((ulong)psVar27 & 1) == 0) goto LAB_0011b8a8;
      a = (secp256k1_fe *)((long)psVar3 * local_118.n[0] + (long)psVar17 * local_148.n[0]);
      modinfo = (secp256k1_modinv64_modinfo *)(ulong)(0x3e - uVar8);
      bVar4 = (byte)(0x3e - uVar8);
      psVar15 = (secp256k1_fe *)((long)a_00 << (bVar4 & 0x3f));
      if (a != psVar15) goto LAB_0011b8ad;
      psVar15 = (secp256k1_fe *)((long)psVar21 * local_118.n[0] + (long)psVar24 * local_148.n[0]);
      a = (secp256k1_fe *)((long)psVar27 << (bVar4 & 0x3f));
      if (psVar15 != a) goto LAB_0011b8b2;
      modinfo = (secp256k1_modinv64_modinfo *)((long)psVar30[-0x10].n + 0x16);
      if (modinfo < (secp256k1_modinv64_modinfo *)0xfffffffffffffa2d) goto LAB_0011b8b7;
      iVar1 = (int)psVar27;
      if ((long)psVar30 < 0) {
        psVar30 = (secp256k1_fe *)-(long)psVar30;
        uVar6 = (int)psVar30 + 1;
        if ((int)uVar8 <= (int)uVar6) {
          uVar6 = uVar8;
        }
        modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar6;
        a = (secp256k1_fe *)(ulong)(uVar6 - 0x3f);
        if (0xffffffc1 < uVar6 - 0x3f) {
          psVar32 = (secp256k1_modinv64_modinfo *)-(long)psVar3;
          unaff_RBP = (secp256k1_modinv64_modinfo *)-(long)psVar17;
          psVar19 = (secp256k1_fe *)-(long)a_00;
          psVar15 = (secp256k1_fe *)
                    ((ulong)(0x3fL << (-(char)uVar6 & 0x3fU)) >> (-(char)uVar6 & 0x3fU));
          uVar6 = (iVar1 * iVar1 + 0x3e) * iVar1 * (int)psVar19 & (uint)psVar15;
          psVar3 = psVar21;
          psVar17 = psVar24;
          psVar33 = psVar32;
          goto LAB_0011b493;
        }
        goto LAB_0011b8c6;
      }
      uVar6 = (int)psVar30 + 1;
      if ((int)uVar8 <= (int)uVar6) {
        uVar6 = uVar8;
      }
      modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar6;
      a = (secp256k1_fe *)(ulong)(uVar6 - 0x3f);
      if (uVar6 - 0x3f < 0xffffffc2) goto LAB_0011b8c1;
      psVar15 = (secp256k1_fe *)((ulong)(0xfL << (-(char)uVar6 & 0x3fU)) >> (-(char)uVar6 & 0x3fU));
      uVar6 = -(iVar1 * (((int)a_00 * 2 + 2U & 8) + (int)a_00)) & (uint)psVar15;
      unaff_RBP = (secp256k1_modinv64_modinfo *)psVar24;
      psVar32 = psVar21;
      psVar19 = psVar27;
      psVar27 = a_00;
LAB_0011b493:
      uVar7 = (ulong)uVar6;
      a = (secp256k1_fe *)(uVar7 * (long)psVar27);
      uVar26 = (long)a->n + (long)psVar19->n;
      psVar24 = (secp256k1_fe *)((long)((secp256k1_fe *)unaff_RBP)->n + (long)psVar17 * uVar7);
      modinfo = (secp256k1_modinv64_modinfo *)(uVar7 * (long)psVar3);
      psVar21 = (secp256k1_modinv64_modinfo *)
                ((long)(psVar32->modulus).v + (long)(modinfo->modulus).v);
      a_00 = psVar27;
      if ((uVar26 & (ulong)psVar15) != 0) {
LAB_0011b8bc:
        psStack_1c0 = (secp256k1_fe *)0x11b8c1;
        secp256k1_fe_inv_var_cold_4();
        a_00 = psVar27;
LAB_0011b8c1:
        psStack_1c0 = (secp256k1_fe *)0x11b8c6;
        secp256k1_fe_inv_var_cold_3();
LAB_0011b8c6:
        psStack_1c0 = (secp256k1_fe *)0x11b8cb;
        secp256k1_fe_inv_var_cold_5();
        goto LAB_0011b8cb;
      }
    }
    a = (secp256k1_fe *)((long)psVar3 * (long)psVar24);
    modinfo = SUB168(SEXT816((long)psVar3) * SEXT816((long)psVar24),8);
    local_e8.u = (int64_t)psVar17;
    local_e8.v = (int64_t)psVar3;
    local_e8.q = (int64_t)psVar24;
    local_e8.r = (int64_t)psVar21;
    if ((long)psVar17 * (long)psVar21 - (long)a != 0x4000000000000000 ||
        SUB168(SEXT816((long)psVar17) * SEXT816((long)psVar21),8) - (long)modinfo !=
        (ulong)((secp256k1_fe *)((long)psVar17 * (long)psVar21) < a)) {
LAB_0011b8cb:
      psStack_1c0 = (secp256k1_fe *)0x11b8d0;
      secp256k1_fe_inv_var_cold_9();
LAB_0011b8d0:
      psStack_1c0 = (secp256k1_fe *)0x11b8d5;
      secp256k1_fe_inv_var_cold_21();
LAB_0011b8d5:
      psStack_1c0 = (secp256k1_fe *)0x11b8da;
      secp256k1_fe_inv_var_cold_20();
LAB_0011b8da:
      psStack_1c0 = (secp256k1_fe *)0x11b8df;
      secp256k1_fe_inv_var_cold_19();
LAB_0011b8df:
      psStack_1c0 = (secp256k1_fe *)0x11b8e4;
      secp256k1_fe_inv_var_cold_18();
      psVar31 = psVar33;
LAB_0011b8e4:
      psStack_1c0 = (secp256k1_fe *)0x11b8e9;
      secp256k1_fe_inv_var_cold_14();
LAB_0011b8e9:
      psStack_1c0 = (secp256k1_fe *)0x11b8ee;
      secp256k1_fe_inv_var_cold_13();
LAB_0011b8ee:
      psStack_1c0 = (secp256k1_fe *)0x11b8f3;
      secp256k1_fe_inv_var_cold_12();
LAB_0011b8f3:
      psStack_1c0 = (secp256k1_fe *)0x11b8f8;
      secp256k1_fe_inv_var_cold_11();
LAB_0011b8f8:
      psStack_1c0 = (secp256k1_fe *)0x11b8fd;
      secp256k1_fe_inv_var_cold_10();
      goto LAB_0011b8fd;
    }
    psStack_1c0 = (secp256k1_fe *)0x11b519;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)&local_c8,&local_98,&local_e8,modinfo);
    uVar8 = local_1ac;
    psVar18 = &local_148;
    psVar15 = (secp256k1_fe *)(ulong)local_1ac;
    psVar17 = (secp256k1_fe *)(ulong)local_1ac;
    psVar33 = &secp256k1_const_modinfo_fe;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1c0 = (secp256k1_fe *)0x11b53d;
    a = psVar18;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,local_1ac,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011b8d0;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar17 = (secp256k1_fe *)(ulong)uVar8;
    psStack_1c0 = (secp256k1_fe *)0x11b557;
    a = psVar18;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar8,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar1) goto LAB_0011b8d5;
    a_00 = &local_118;
    psVar17 = (secp256k1_fe *)(ulong)uVar8;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1c0 = (secp256k1_fe *)0x11b57b;
    a = a_00;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,uVar8,&secp256k1_const_modinfo_fe.modulus
                       ,-1);
    if (iVar1 < 1) goto LAB_0011b8da;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar17 = (secp256k1_fe *)(ulong)uVar8;
    psStack_1c0 = (secp256k1_fe *)0x11b595;
    a = a_00;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,uVar8,&secp256k1_const_modinfo_fe.modulus
                       ,1);
    if (-1 < iVar1) goto LAB_0011b8df;
    psStack_1c0 = (secp256k1_fe *)0x11b5b2;
    secp256k1_modinv64_update_fg_62_var
              (uVar8,(secp256k1_modinv64_signed62 *)psVar18,(secp256k1_modinv64_signed62 *)a_00,
               &local_e8);
    psVar31 = local_180;
    if (local_118.n[0] != 0) {
LAB_0011b5c6:
      lVar23 = (long)(int)uVar8;
      uVar7 = local_178.n[lVar23 + 5];
      modinfo = (secp256k1_modinv64_modinfo *)local_148.n[lVar23 + 5];
      a = (secp256k1_fe *)((long)uVar7 >> 0x3f ^ uVar7 | lVar23 + -2 >> 0x3f);
      psVar17 = (secp256k1_fe *)((long)modinfo >> 0x3f ^ (ulong)modinfo | (ulong)a);
      if (psVar17 == (secp256k1_fe *)0x0) {
        psVar15 = (secp256k1_fe *)(ulong)(uVar8 - 1);
        local_178.n[lVar23 + 4] = local_178.n[lVar23 + 4] | uVar7 << 0x3e;
        modinfo = (secp256k1_modinv64_modinfo *)((long)modinfo << 0x3e);
        local_148.n[lVar23 + 4] = local_148.n[lVar23 + 4] | (ulong)modinfo;
      }
      iVar1 = (int)local_180;
      if (10 < iVar1) goto LAB_0011b8e4;
      unaff_RBP = &secp256k1_const_modinfo_fe;
      modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
      psStack_1c0 = (secp256k1_fe *)0x11b636;
      alen = (int)psVar15;
      psVar17 = psVar15;
      a = psVar18;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,alen,
                         &secp256k1_const_modinfo_fe.modulus,-1);
      if (iVar2 < 1) goto LAB_0011b8e9;
      modinfo = (secp256k1_modinv64_modinfo *)0x1;
      psStack_1c0 = (secp256k1_fe *)0x11b650;
      psVar17 = psVar15;
      a = psVar18;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,alen,
                         &secp256k1_const_modinfo_fe.modulus,1);
      if (0 < iVar2) goto LAB_0011b8ee;
      modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
      psStack_1c0 = (secp256k1_fe *)0x11b66c;
      psVar17 = psVar15;
      a = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,alen,
                         &secp256k1_const_modinfo_fe.modulus,-1);
      if (iVar2 < 1) goto LAB_0011b8f3;
      modinfo = (secp256k1_modinv64_modinfo *)0x1;
      psStack_1c0 = (secp256k1_fe *)0x11b686;
      psVar17 = psVar15;
      a = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,alen,
                         &secp256k1_const_modinfo_fe.modulus,1);
      if (iVar2 < 0) {
        bVar5 = true;
        psVar31 = (secp256k1_modinv64_modinfo *)(ulong)(iVar1 + 1);
        goto LAB_0011b6be;
      }
      goto LAB_0011b8f8;
    }
    if (1 < (int)uVar8) {
      uVar7 = 1;
      uVar9 = 0;
      do {
        uVar9 = uVar9 | local_118.n[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
      if (uVar9 != 0) goto LAB_0011b5c6;
    }
    bVar5 = false;
LAB_0011b6be:
  } while (bVar5);
  a = &local_118;
  iVar2 = (int)psVar15;
  modinfo = (secp256k1_modinv64_modinfo *)0x0;
  psStack_1c0 = (secp256k1_fe *)0x11b6de;
  psVar17 = psVar15;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a,iVar2,&SECP256K1_SIGNED62_ONE,0);
  if (iVar1 == 0) {
    psStack_1c0 = (secp256k1_fe *)0x11b700;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)&local_148,iVar2,&SECP256K1_SIGNED62_ONE,-1);
    psVar3 = extraout_RDX;
    if (iVar1 == 0) {
LAB_0011b783:
      psStack_1c0 = (secp256k1_fe *)0x11b79b;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)&local_c8,local_178.n[(long)iVar2 + 5],psVar3);
      psVar15 = local_188;
      local_178.n[4] = local_c8.n[4];
      local_178.n[2] = local_c8.n[2];
      local_178.n[3] = local_c8.n[3];
      local_178.n[0] = local_c8.n[0];
      local_178.n[1] = local_c8.n[1];
      psStack_1c0 = (secp256k1_fe *)0x11b7c3;
      secp256k1_fe_from_signed62(local_188,(secp256k1_modinv64_signed62 *)&local_178);
      psVar15->magnitude = (uint)(0 < local_1a8->magnitude);
      psVar15->normalized = 1;
      psStack_1c0 = (secp256k1_fe *)0x11b7e3;
      secp256k1_fe_verify(psVar15);
      uVar9 = (psVar15->n[4] >> 0x30) * local_1a0 + psVar15->n[0];
      uVar7 = (uVar9 >> 0x34) + psVar15->n[1];
      uVar10 = (uVar7 >> 0x34) + psVar15->n[2];
      uVar11 = (uVar10 >> 0x34) + psVar15->n[3];
      psVar17 = (secp256k1_fe *)((uVar11 >> 0x34) + (psVar15->n[4] & 0xffffffffffff));
      a = (secp256k1_fe *)
          ((uVar9 ^ 0x1000003d0) & uVar7 & uVar10 & uVar11 & ((ulong)psVar17 ^ 0xf000000000000));
      bVar5 = a == (secp256k1_fe *)0xfffffffffffff ||
              ((uVar7 | uVar9 | uVar10 | uVar11) & 0xfffffffffffff) == 0 &&
              psVar17 == (secp256k1_fe *)0x0;
      modinfo = (secp256k1_modinv64_modinfo *)
                CONCAT71((int7)(((ulong)psVar17 ^ 0xf000000000000) >> 8),bVar5);
      if ((local_198 != 0xfffffffffffff && local_190 != 0) != bVar5) {
        secp256k1_fe_verify(psVar15);
        return;
      }
      goto LAB_0011b902;
    }
    psStack_1c0 = (secp256k1_fe *)0x11b71c;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)&local_148,iVar2,&SECP256K1_SIGNED62_ONE,1);
    psVar3 = extraout_RDX_00;
    if (iVar1 == 0) goto LAB_0011b783;
    a = &local_178;
    psVar17 = (secp256k1_fe *)0x5;
    modinfo = (secp256k1_modinv64_modinfo *)0x0;
    psStack_1c0 = (secp256k1_fe *)0x11b738;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar1 == 0) {
      a = &local_c8;
      psVar17 = (secp256k1_fe *)0x5;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      psStack_1c0 = (secp256k1_fe *)0x11b75b;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar1 == 0) {
        a = &local_148;
        modinfo = (secp256k1_modinv64_modinfo *)0x1;
        psStack_1c0 = (secp256k1_fe *)0x11b77b;
        psVar17 = psVar15;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a,iVar2,
                           &secp256k1_const_modinfo_fe.modulus,1);
        psVar3 = extraout_RDX_01;
        if (iVar1 == 0) goto LAB_0011b783;
      }
    }
  }
  else {
LAB_0011b8fd:
    psStack_1c0 = (secp256k1_fe *)0x11b902;
    secp256k1_fe_inv_var_cold_15();
LAB_0011b902:
    psStack_1c0 = (secp256k1_fe *)0x11b907;
    secp256k1_fe_inv_var_cold_17();
  }
  psStack_1c0 = (secp256k1_fe *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_16();
  iVar1 = (int)a;
  psStack_1e8 = psVar15;
  psStack_1e0 = psVar18;
  psStack_1d8 = a_00;
  psStack_1d0 = psVar30;
  psStack_1c8 = psVar31;
  psStack_1c0 = (secp256k1_fe *)unaff_RBP;
  if (iVar1 < 1) {
LAB_0011bbc6:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbcb;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011bbcb:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbd0;
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0011bbd0:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbd5;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011bbd5:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbda;
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_0011bbda:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbdf;
    secp256k1_modinv64_update_fg_62_var_cold_4();
  }
  else {
    psVar31 = (secp256k1_modinv64_modinfo *)0x7fffffffffffffff;
    lStack_1f0 = (modinfo->modulus).v[0];
    lStack_1f8 = (modinfo->modulus).v[1];
    uVar26 = psVar17->n[0];
    lVar23 = *extraout_RDX_02;
    psVar30 = (secp256k1_fe *)(uVar26 * lStack_1f0);
    psVar15 = SUB168(SEXT816((long)uVar26) * SEXT816(lStack_1f0),8);
    uVar7 = lVar23 * lStack_1f8;
    lVar12 = SUB168(SEXT816(lVar23) * SEXT816(lStack_1f8),8);
    lVar13 = (0x7fffffffffffffff - lVar12) - (long)psVar15;
    if (-1 < lVar12 &&
        (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar15) !=
        SBORROW8(lVar13,(ulong)((secp256k1_fe *)~uVar7 < psVar30))) !=
        (long)(lVar13 - (ulong)((secp256k1_fe *)~uVar7 < psVar30)) < 0) goto LAB_0011bbcb;
    lStack_200 = (modinfo->modulus).v[2];
    puVar28 = (uint64_t *)((long)psVar30->n + uVar7);
    lVar22 = (long)psVar15->n + (ulong)CARRY8(uVar7,(ulong)psVar30) + lVar12;
    lStack_208 = (modinfo->modulus).v[3];
    psVar15 = (secp256k1_fe *)(uVar26 * lStack_200);
    lVar13 = SUB168(SEXT816((long)uVar26) * SEXT816(lStack_200),8);
    uVar7 = lVar23 * lStack_208;
    lVar12 = SUB168(SEXT816(lVar23) * SEXT816(lStack_208),8);
    psVar30 = (secp256k1_fe *)(-1 - uVar7);
    lVar23 = (0x7fffffffffffffff - lVar12) - lVar13;
    if (-1 < lVar12 &&
        (SBORROW8(0x7fffffffffffffff - lVar12,lVar13) != SBORROW8(lVar23,(ulong)(psVar30 < psVar15))
        ) != (long)(lVar23 - (ulong)(psVar30 < psVar15)) < 0) goto LAB_0011bbd0;
    puVar25 = (uint64_t *)((long)psVar15->n + uVar7);
    lVar23 = lVar12 + lVar13 + (ulong)CARRY8(uVar7,(ulong)psVar15);
    if (((ulong)puVar28 & 0x3fffffffffffffff) != 0) goto LAB_0011bbd5;
    if (((ulong)puVar25 & 0x3fffffffffffffff) != 0) goto LAB_0011bbda;
    uVar7 = (ulong)puVar25 >> 0x3e | lVar23 * 4;
    uVar9 = (ulong)puVar28 >> 0x3e | lVar22 * 4;
    lVar23 = lVar23 >> 0x3e;
    lVar22 = lVar22 >> 0x3e;
    iStack_21c = iVar1;
    if (iVar1 != 1) {
      psStack_218 = (secp256k1_fe *)((ulong)a & 0xffffffff);
      a = (secp256k1_fe *)0x1;
      do {
        uVar26 = psVar17->n[(long)a];
        psVar30 = (secp256k1_fe *)(uVar26 * lStack_1f0 + uVar9);
        psVar15 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uVar26) * SEXT816(lStack_1f0),8) + lVar22 +
                  (ulong)CARRY8(uVar26 * lStack_1f0,uVar9));
        lVar13 = extraout_RDX_02[(long)a];
        psVar31 = (secp256k1_modinv64_modinfo *)(lVar13 * lStack_1f8);
        lVar14 = SUB168(SEXT816(lVar13) * SEXT816(lStack_1f8),8);
        uVar9 = (ulong)((secp256k1_fe *)(-1 - (long)psVar31) < psVar30);
        lVar12 = (0x7fffffffffffffff - lVar14) - (long)psVar15;
        psVar18 = (secp256k1_fe *)0x8000000000000000;
        lVar29 = (-0x8000000000000000 - lVar14) -
                 (ulong)(psVar31 != (secp256k1_modinv64_modinfo *)0x0);
        lVar22 = (long)psVar15 - lVar29;
        bVar5 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar15) != SBORROW8(lVar12,uVar9)) ==
                (long)(lVar12 - uVar9) < 0;
        if (lVar14 < 0) {
          bVar5 = (SBORROW8((long)psVar15,lVar29) !=
                  SBORROW8(lVar22,(ulong)(psVar30 < (secp256k1_fe *)-(long)psVar31))) ==
                  (long)(lVar22 - (ulong)(psVar30 < (secp256k1_fe *)-(long)psVar31)) < 0;
        }
        psStack_210 = psVar17;
        if (!bVar5) {
          psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbc1;
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0011bbc1:
          psVar17 = psVar18;
          psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbc6;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_0011bbc6;
        }
        uVar11 = uVar26 * lStack_200 + uVar7;
        lVar29 = SUB168(SEXT816((long)uVar26) * SEXT816(lStack_200),8) + lVar23 +
                 (ulong)CARRY8(uVar26 * lStack_200,uVar7);
        uVar10 = lVar13 * lStack_208;
        lVar12 = SUB168(SEXT816(lVar13) * SEXT816(lStack_208),8);
        uVar7 = (ulong)(-uVar10 - 1 < uVar11);
        lVar23 = (0x7fffffffffffffff - lVar12) - lVar29;
        lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar10 != 0);
        lVar13 = lVar29 - lVar22;
        bVar5 = (SBORROW8(0x7fffffffffffffff - lVar12,lVar29) != SBORROW8(lVar23,uVar7)) ==
                (long)(lVar23 - uVar7) < 0;
        if (lVar12 < 0) {
          bVar5 = (SBORROW8(lVar29,lVar22) != SBORROW8(lVar13,(ulong)(uVar11 < -uVar10))) ==
                  (long)(lVar13 - (ulong)(uVar11 < -uVar10)) < 0;
        }
        if (!bVar5) goto LAB_0011bbc1;
        uVar7 = (long)psVar30->n + (long)&psVar31->modulus;
        lVar22 = (long)psVar15->n + (ulong)CARRY8((ulong)psVar31,(ulong)psVar30) + lVar14;
        lVar23 = lVar12 + lVar29 + (ulong)CARRY8(uVar10,uVar11);
        uVar9 = lVar22 * 4 | uVar7 >> 0x3e;
        psVar31 = (secp256k1_modinv64_modinfo *)(uVar7 & 0x3fffffffffffffff);
        psVar17->n[(long)((long)&a[-1].normalized + 3)] = (uint64_t)psVar31;
        uVar7 = lVar23 * 4 | uVar10 + uVar11 >> 0x3e;
        extraout_RDX_02[(long)((long)&a[-1].normalized + 3)] = uVar10 + uVar11 & 0x3fffffffffffffff;
        a = (secp256k1_fe *)((long)a->n + 1);
        lVar23 = lVar23 >> 0x3e;
        lVar22 = lVar22 >> 0x3e;
      } while (psStack_218 != a);
    }
    if (lVar22 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
      psVar17->n[(long)iVar1 + -1] = uVar9;
      if (lVar23 + -1 + (ulong)(0x7fffffffffffffff < uVar7) == -1) {
        extraout_RDX_02[(long)iVar1 + -1] = uVar7;
        return;
      }
      goto LAB_0011bbe4;
    }
  }
  psStack_228 = (secp256k1_modinv64_modinfo *)0x11bbe4;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011bbe4:
  psStack_228 = (secp256k1_modinv64_modinfo *)secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar20 = &sStack_2a0;
  psStack_238 = psVar15;
  psStack_230 = psVar30;
  psStack_228 = psVar31;
  for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
    *(uint64_t *)psVar20->s = psVar17->n[0];
    psVar17 = (secp256k1_fe *)((long)psVar17 + (ulong)bVar34 * -0x10 + 8);
    psVar20 = (secp256k1_sha256 *)((long)psVar20 + (ulong)bVar34 * -0x10 + 8);
  }
  uVar7 = sStack_2a0.bytes >> 6;
  psStack_2b0 = (secp256k1_sha256 *)0x11bc21;
  secp256k1_sha256_write(&sStack_2a0,auStack_2a4,4);
  psStack_2b0 = (secp256k1_sha256 *)0x11bc2c;
  psVar20 = &sStack_2a0;
  secp256k1_sha256_finalize(&sStack_2a0,(uchar *)a);
  if (sStack_2a0.bytes >> 6 != uVar7 + 1) {
    psStack_2b0 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
    secp256k1_ellswift_prng_cold_1();
    psStack_2b8 = a;
    psStack_2b0 = &sStack_2a0;
    secp256k1_fe_sqr(&sStack_2e8,(secp256k1_fe *)psVar20);
    secp256k1_fe_mul(&sStack_2e8,&sStack_2e8,(secp256k1_fe *)psVar20);
    secp256k1_fe_verify(&sStack_2e8);
    sStack_2e8.n[0] = sStack_2e8.n[0] + 2;
    sStack_2e8.magnitude = sStack_2e8.magnitude + 1;
    sStack_2e8.normalized = 0;
    secp256k1_fe_verify(&sStack_2e8);
    secp256k1_fe_is_square_var(&sStack_2e8);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}